

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::SwapBuffersWithDamageTests::init(SwapBuffersWithDamageTests *this,EVP_PKEY_CTX *ctx)

{
  int iterationTimes;
  EglTestContext *eglTestCtx;
  pointer pvVar1;
  int extraout_EAX;
  long lVar2;
  TestCaseGroup *this_00;
  SwapBuffersWithDamageTest *pSVar3;
  allocator_type *in_RCX;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_00;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_01;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *frameDrawType;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *extraout_RDX_02;
  char *in_R9;
  _anonymous_namespace_ *p_Var4;
  _anonymous_namespace_ *this_01;
  long lVar5;
  long lVar6;
  bool bVar7;
  char *in_stack_ffffffffffffff38;
  string name;
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  frameDrawTypes;
  DrawType renderClear [2];
  DrawType clearRender [2];
  long local_58;
  string local_50;
  
  clearRender[0] = DRAWTYPE_GLES2_CLEAR;
  clearRender[1] = DRAWTYPE_GLES2_RENDER;
  renderClear[0] = DRAWTYPE_GLES2_RENDER;
  renderClear[1] = DRAWTYPE_GLES2_CLEAR;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  frameDrawTypes.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p._0_4_ = 0;
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
            *)&name,1,(value_type *)&local_50,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&name);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                   *)&name);
  local_50._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
            *)&name,1,(value_type *)&local_50,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&name);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                   *)&name);
  local_50._M_dataplus._M_p._0_4_ = 0;
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
            *)&name,2,(value_type *)&local_50,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&name);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                   *)&name);
  local_50._M_dataplus._M_p._0_4_ = 1;
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::vector((vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
            *)&name,2,(value_type *)&local_50,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&name);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                   *)&name);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&name,clearRender,(DrawType *)&local_58,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&name);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                   *)&name);
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::DrawType>>
              *)&name,renderClear,clearRender,in_RCX);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::push_back(&frameDrawTypes,(value_type *)&name);
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                   *)&name);
  pvVar1 = frameDrawTypes.
           super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = ((long)frameDrawTypes.
                 super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)frameDrawTypes.
                super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar5 = 0;
  while (lVar5 != 3) {
    iterationTimes = (&DAT_017ec1a0)[lVar5];
    local_58 = lVar5;
    this_00 = (TestCaseGroup *)operator_new(0x78);
    eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
    if (iterationTimes == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"resize_after_swap",(allocator<char> *)&local_50);
    }
    else if (iterationTimes == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"resize_before_swap",(allocator<char> *)&local_50);
    }
    else if (iterationTimes == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"no_resize",(allocator<char> *)&local_50);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_50);
    }
    TestCaseGroup::TestCaseGroup
              (this_00,eglTestCtx,name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1);
    std::__cxx11::string::~string((string *)&name);
    frameDrawType = extraout_RDX;
    p_Var4 = (_anonymous_namespace_ *)pvVar1;
    lVar5 = lVar2;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, this_01 = (_anonymous_namespace_ *)pvVar1,
          lVar6 = lVar2, bVar7) {
      egl::(anonymous_namespace)::generateTestName_abi_cxx11_(&name,p_Var4,frameDrawType);
      pSVar3 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
      egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                (pSVar3,(this->super_TestCaseGroup).m_eglTestCtx,
                 (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                  *)p_Var4,iterationTimes,(ResizeType)name._M_dataplus._M_p,in_R9,
                 in_stack_ffffffffffffff38);
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar3);
      std::__cxx11::string::~string((string *)&name);
      p_Var4 = p_Var4 + 0x18;
      frameDrawType = extraout_RDX_00;
    }
    while (p_Var4 = (_anonymous_namespace_ *)pvVar1, lVar5 = lVar2, lVar6 != 0) {
      egl::(anonymous_namespace)::generateTestName_abi_cxx11_(&local_50,this_01,frameDrawType);
      std::operator+(&name,"preserve_buffer_",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pSVar3 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
      egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                (pSVar3,(this->super_TestCaseGroup).m_eglTestCtx,
                 (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                  *)this_01,iterationTimes,(ResizeType)name._M_dataplus._M_p,in_R9,
                 in_stack_ffffffffffffff38);
      (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SwapBuffersWithDamageTest_01e0afa0;
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar3);
      std::__cxx11::string::~string((string *)&name);
      frameDrawType = extraout_RDX_01;
      this_01 = this_01 + 0x18;
      lVar6 = lVar6 + -1;
    }
    while (lVar5 != 0) {
      egl::(anonymous_namespace)::generateTestName_abi_cxx11_(&local_50,p_Var4,frameDrawType);
      std::operator+(&name,"buffer_age_",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pSVar3 = (SwapBuffersWithDamageTest *)operator_new(0x1af8);
      egl::anon_unknown_0::SwapBuffersWithDamageTest::SwapBuffersWithDamageTest
                (pSVar3,(this->super_TestCaseGroup).m_eglTestCtx,
                 (vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                  *)p_Var4,iterationTimes,(ResizeType)name._M_dataplus._M_p,in_R9,
                 in_stack_ffffffffffffff38);
      (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SwapBuffersWithDamageTest_01e0b000;
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar3);
      std::__cxx11::string::~string((string *)&name);
      frameDrawType = extraout_RDX_02;
      p_Var4 = p_Var4 + 0x18;
      lVar5 = lVar5 + -1;
    }
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    lVar5 = local_58 + 1;
  }
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>_>_>
  ::~vector(&frameDrawTypes);
  return extraout_EAX;
}

Assistant:

void SwapBuffersWithDamageTests::init (void)
{
	const DrawType clearRender[2] =
	{
		DRAWTYPE_GLES2_CLEAR,
		DRAWTYPE_GLES2_RENDER
	};

	const DrawType renderClear[2] =
	{
		DRAWTYPE_GLES2_RENDER,
		DRAWTYPE_GLES2_CLEAR
	};

	const ResizeType resizeTypes[] =
	{
		RESIZETYPE_NONE,
		RESIZETYPE_BEFORE_SWAP,
		RESIZETYPE_AFTER_SWAP
	};

	vector< vector<DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (1, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<DrawType> (2, DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (size_t resizeTypeNdx = 0; resizeTypeNdx < DE_LENGTH_OF_ARRAY(resizeTypes); resizeTypeNdx++)
	{
		const ResizeType		resizeType	= resizeTypes[resizeTypeNdx];
		TestCaseGroup* const	resizeGroup	= new TestCaseGroup(m_eglTestCtx, generateResizeGroupName(resizeType).c_str(), "");

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "preserve_buffer_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndPreserveBufferTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(), ""));
		}

		for (size_t drawTypeNdx = 0; drawTypeNdx < frameDrawTypes.size(); drawTypeNdx++)
		{
			string name = "buffer_age_" + generateTestName(frameDrawTypes[drawTypeNdx]);
			resizeGroup->addChild(new SwapBuffersWithDamageAndBufferAgeTest(m_eglTestCtx, frameDrawTypes[drawTypeNdx], 4, resizeType, name.c_str(),  ""));
		}

		addChild(resizeGroup);
	}
}